

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O0

void __thiscall
Utils::ArgumentParser::ArgumentParser(ArgumentParser *this,string *_short,string *_long)

{
  string *_long_local;
  string *_short_local;
  ArgumentParser *this_local;
  
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->used_name)._M_t._M_impl = 0;
  *(undefined8 *)&(this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->used_name);
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->used_identifier)._M_t._M_impl = 0;
  *(undefined8 *)&(this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->used_identifier);
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::vector
            (&this->positionals);
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::vector(&this->options);
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::vector(&this->flags);
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->option_mapping)._M_t._M_impl = 0;
  *(undefined8 *)&(this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
  ::map(&this->option_mapping);
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->flag_mapping)._M_t._M_impl = 0;
  *(undefined8 *)&(this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
  ::map(&this->flag_mapping);
  std::__cxx11::string::string((string *)&this->program_name);
  std::__cxx11::string::string((string *)&this->short_text,(string *)_short);
  std::__cxx11::string::string((string *)&this->long_text,(string *)_long);
  return;
}

Assistant:

ArgumentParser( const std::string& _short, const std::string& _long) :
        used_name(),
        used_identifier(),
        positionals(),
        options(),
        flags(),
        option_mapping(),
        flag_mapping(),
        program_name(),
        short_text(_short),
        long_text(_long)
    {}